

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O0

void __thiscall wasm::JSPI::run(JSPI *this,Module *module)

{
  Expression *init;
  char **ppcVar1;
  Name suspender_00;
  Name suspender_01;
  IString str;
  bool bVar2;
  pointer pFVar3;
  RefNull *pRVar4;
  pointer pEVar5;
  Name *this_00;
  mapped_type *this_01;
  reference this_02;
  pointer pEVar6;
  size_type sVar7;
  reference ppEVar8;
  pointer ppVar9;
  Function *pFVar10;
  RefFunc *pRVar11;
  reference ppFVar12;
  char *pcVar13;
  Name NVar14;
  string_view sVar15;
  Name base;
  Name name_00;
  bool local_702;
  bool local_681;
  Split local_5f0;
  byte local_5c9;
  size_t local_5c8;
  char *pcStack_5c0;
  wasm *local_5b8;
  char *pcStack_5b0;
  string local_5a8;
  Function *local_588;
  Function *im;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2_3;
  reference local_560;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2_2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  RefFunc *replacementRef;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_4e0;
  iterator iter_1;
  RefFunc *get;
  Index i;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2_1;
  string_view local_498;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_488;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_480;
  iterator iter;
  Name wrapperName;
  Function *func;
  Name *name;
  Split local_438;
  byte local_411;
  string local_410;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *local_3f0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  wrappedExports;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_370;
  string_view local_368;
  char *pcStack_358;
  Name suspender;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  Name local_2b8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_2a8;
  Type local_290;
  Type local_288;
  Signature local_280;
  HeapType local_270;
  char *local_268;
  HeapType HStack_260;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_250;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  string local_240;
  byte local_21a;
  allocator<char> local_219;
  undefined1 local_218 [6];
  bool wasmSplit;
  undefined1 local_1f8 [8];
  Split listedExports;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  string stateChangingExports;
  string local_120;
  undefined1 local_100 [8];
  Split listedImports;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string stateChangingImports;
  Builder builder;
  Module *module_local;
  JSPI *this_local;
  
  Builder::Builder((Builder *)((long)&stateChangingImports.field_2 + 8),module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"jspi-imports",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"",(allocator<char> *)&listedImports.field_0x1f);
  Pass::getArgumentOrDefault(&local_80,&this->super_Pass,&local_a0,&local_d8);
  read_possible_response_file(&local_60,&local_80);
  String::trim((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&listedImports.field_0x1f);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,",",
             (allocator<char> *)(stateChangingExports.field_2._M_local_buf + 0xf));
  String::Split::Split((Split *)local_100,(string *)local_40,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)(stateChangingExports.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"jspi-exports",&local_1a9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"",(allocator<char> *)&listedExports.field_0x1f);
  Pass::getArgumentOrDefault(&local_188,&this->super_Pass,&local_1a8,&local_1d0);
  read_possible_response_file(&local_168,&local_188);
  String::trim((string *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&listedExports.field_0x1f);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_218,",",&local_219);
  String::Split::Split((Split *)local_1f8,(string *)local_148,(string *)local_218);
  std::__cxx11::string::~string((string *)local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"jspi-split-module",
             (allocator<char> *)
             ((long)&import._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7));
  bVar2 = Pass::hasArgument(&this->super_Pass,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7));
  local_21a = bVar2;
  if (bVar2) {
    local_268 = (char *)ModuleSplitting::LOAD_SECONDARY_MODULE._0_8_;
    HStack_260.id = ModuleSplitting::LOAD_SECONDARY_MODULE._8_8_;
    wasm::Type::Type(&local_288,none);
    wasm::Type::Type(&local_290,none);
    Signature::Signature(&local_280,local_288,local_290);
    HeapType::HeapType(&local_270,local_280);
    local_2a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_2a8);
    NVar14.super_IString.str._M_str = local_268;
    NVar14.super_IString.str._M_len = (size_t)&local_250;
    Builder::makeFunction
              (NVar14,HStack_260,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_270.id,
               (Expression *)&local_2a8);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_2a8);
    local_2c8 = ENV._0_8_;
    uStack_2c0 = ENV._8_8_;
    str.str._M_str = (char *)ENV._8_8_;
    str.str._M_len = ENV._0_8_;
    wasm::Name::Name(&local_2b8,str);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_250);
    wasm::Name::operator=(&(pFVar3->super_Importable).module,&local_2b8);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_250);
    wasm::Name::operator=
              (&(pFVar3->super_Importable).base,(Name *)ModuleSplitting::LOAD_SECONDARY_MODULE);
    Module::addFunction(module,&local_250);
    IString::toString_abi_cxx11_(&local_328,(IString *)ENV);
    std::operator+(&local_308,&local_328,".");
    IString::toString_abi_cxx11_
              ((string *)&suspender.super_IString.str._M_str,
               (IString *)ModuleSplitting::LOAD_SECONDARY_MODULE);
    std::operator+(&local_2e8,&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &suspender.super_IString.str._M_str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&suspender.super_IString.str._M_str);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_250);
  }
  wasm::Name::Name((Name *)&local_368,"suspender");
  NVar14 = Names::getValidGlobalName(module,(Name)local_368);
  init = (Expression *)(this->externref).id;
  pcStack_358 = NVar14.super_IString.str._M_len;
  suspender.super_IString.str._M_len = NVar14.super_IString.str._M_str;
  HeapType::HeapType((HeapType *)&wrappedExports._M_h._M_single_bucket,noext);
  pRVar4 = Builder::makeRefNull
                     ((Builder *)((long)&stateChangingImports.field_2 + 8),
                      (HeapType)wrappedExports._M_h._M_single_bucket);
  pcVar13 = (char *)0x0;
  name_00.super_IString.str._M_str = NVar14.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_370;
  Builder::makeGlobal(name_00,(Type)NVar14.super_IString.str._M_str,init,(Mutability)pRVar4);
  Module::addGlobal(module,&local_370);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_370);
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::unordered_map((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   *)&__range2);
  __end2 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&module->exports);
  ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
       std::
       vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ::end(&module->exports);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                *)&ex);
    if (!bVar2) break;
    local_3f0 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                ::operator*(&__end2);
    pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       (local_3f0);
    local_411 = 0;
    local_681 = false;
    if (pEVar5->kind == Function) {
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_3f0);
      IString::toString_abi_cxx11_(&local_410,(IString *)pEVar5);
      local_411 = 1;
      String::Split::Split(&local_438,(Split *)local_1f8);
      local_681 = canChangeState(&local_410,&local_438);
      String::Split::~Split(&local_438);
    }
    if ((local_411 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_410);
    }
    if (local_681 != false) {
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_3f0);
      this_00 = Export::getInternalName(pEVar5);
      pFVar10 = Module::getFunction(module,(Name)(this_00->super_IString).str);
      wasm::Name::Name((Name *)&iter);
      local_480._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::find((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   *)&__range2,(key_type *)pFVar10);
      local_488._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::end((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  *)&__range2);
      bVar2 = std::__detail::operator==(&local_480,&local_488);
      if (bVar2) {
        suspender_01.super_IString.str._M_str = (char *)suspender.super_IString.str._M_len;
        suspender_01.super_IString.str._M_len = (size_t)pcStack_358;
        sVar15 = (string_view)makeWrapperForExport(this,pFVar10,module,suspender_01);
        local_498 = sVar15;
        wasm::Name::operator=((Name *)&iter,(Name *)&local_498);
        this_01 = std::
                  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                *)&__range2,(key_type *)pFVar10);
        wasm::Name::operator=(this_01,(Name *)&iter);
      }
      else {
        ppVar9 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>
                               *)&local_480);
        wasm::Name::operator=((Name *)&iter,&ppVar9->second);
      }
      wasm::Name::operator=(this_00,(Name *)&iter);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::begin(&module->elementSegments);
  segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
            std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::end(&module->elementSegments);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                        *)&segment);
    if (!bVar2) break;
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
              ::operator*(&__end2_1);
    pEVar6 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(this_02);
    bVar2 = wasm::Type::isFunction(&pEVar6->type);
    if (bVar2) {
      get._4_4_ = 0;
      while( true ) {
        pEVar6 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(this_02);
        sVar7 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          (&pEVar6->data);
        if (sVar7 <= get._4_4_) break;
        pEVar6 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(this_02);
        ppEVar8 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            (&pEVar6->data,(ulong)get._4_4_);
        iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur =
             (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>)
             Expression::dynCast<wasm::RefFunc>(*ppEVar8);
        if (iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur
            != (__node_type *)0x0) {
          local_4e0._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::find((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       *)&__range2,
                      (key_type *)
                      ((long)&(((__node_type *)
                               iter_1.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_wasm::Name,_wasm::Name>,_true>)
                              .super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::Name>_>
                              ._M_storage._M_storage + 8));
          replacementRef =
               (RefFunc *)
               std::
               unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::end((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)&__range2);
          bVar2 = std::__detail::operator==
                            (&local_4e0,
                             (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> *)
                             &replacementRef);
          if (!bVar2) {
            ppVar9 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>
                                 *)&local_4e0);
            sVar15 = (ppVar9->second).super_IString.str;
            ppVar9 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>
                                 *)&local_4e0);
            originalFunctions.
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(ppVar9->second).super_IString.str._M_len;
            pFVar10 = Module::getFunction(module,(Name)(ppVar9->second).super_IString.str);
            pRVar11 = Builder::makeRefFunc
                                ((Builder *)((long)&stateChangingImports.field_2 + 8),(Name)sVar15,
                                 (HeapType)(pFVar10->type).id);
            pEVar6 = std::
                     unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                     operator->(this_02);
            ppEVar8 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                      operator[](&pEVar6->data,(ulong)get._4_4_);
            *ppEVar8 = (value_type)pRVar11;
          }
        }
        get._4_4_ = get._4_4_ + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  __end2_2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&module->functions);
  func_1 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(&module->functions);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                        *)&func_1);
    if (!bVar2) break;
    local_560 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end2_2);
    __range2_3 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                 std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                           (local_560);
    std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
              ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2,
               (value_type *)&__range2_3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                       ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  im = (Function *)
       std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                 ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                        *)&im);
    if (!bVar2) break;
    ppFVar12 = __gnu_cxx::
               __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
               ::operator*(&__end2_3);
    local_588 = *ppFVar12;
    local_5c9 = 0;
    bVar2 = Importable::imported(&local_588->super_Importable);
    local_702 = false;
    if (bVar2) {
      local_5b8 = (wasm *)(local_588->super_Importable).module.super_IString.str._M_len;
      ppcVar1 = &(local_588->super_Importable).module.super_IString.str._M_str;
      pcStack_5b0 = *ppcVar1;
      local_5c8 = (local_588->super_Importable).base.super_IString.str._M_len;
      pcStack_5c0 = (local_588->super_Importable).base.super_IString.str._M_str;
      base.super_IString.str._M_str = pcVar13;
      base.super_IString.str._M_len = (size_t)pcStack_5c0;
      getFullFunctionName_abi_cxx11_(&local_5a8,local_5b8,(IString)*(IString *)ppcVar1,base);
      local_5c9 = 1;
      String::Split::Split(&local_5f0,(Split *)local_100);
      local_702 = canChangeState(&local_5a8,&local_5f0);
      String::Split::~Split(&local_5f0);
    }
    if ((local_5c9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5a8);
    }
    if (local_702 != false) {
      suspender_00.super_IString.str._M_str = (char *)suspender.super_IString.str._M_len;
      suspender_00.super_IString.str._M_len = (size_t)pcStack_358;
      pcVar13 = (char *)(ulong)(local_21a & 1);
      makeWrapperForImport(this,local_588,module,suspender_00,SUB41(local_21a & 1,0));
    }
    __gnu_cxx::
    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2_3);
  }
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~unordered_map((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&__range2);
  String::Split::~Split((Split *)local_1f8);
  std::__cxx11::string::~string((string *)local_148);
  String::Split::~Split((Split *)local_100);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void run(Module* module) override {
    Builder builder(*module);

    // Find which imports can suspend.
    auto stateChangingImports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-imports", "")));
    String::Split listedImports(stateChangingImports, ",");

    // Find which exports should create a promise.
    auto stateChangingExports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-exports", "")));
    String::Split listedExports(stateChangingExports, ",");

    bool wasmSplit = hasArgument("jspi-split-module");
    if (wasmSplit) {
      // Make an import for the load secondary module function so a JSPI wrapper
      // version will be created.
      auto import =
        Builder::makeFunction(ModuleSplitting::LOAD_SECONDARY_MODULE,
                              Signature(Type::none, Type::none),
                              {});
      import->module = ENV;
      import->base = ModuleSplitting::LOAD_SECONDARY_MODULE;
      module->addFunction(std::move(import));
      listedImports.push_back(
        ENV.toString() + "." +
        ModuleSplitting::LOAD_SECONDARY_MODULE.toString());
    }

    // Create a global to store the suspender that is passed into exported
    // functions and will then need to be passed out to the imported functions.
    Name suspender = Names::getValidGlobalName(*module, "suspender");
    module->addGlobal(builder.makeGlobal(suspender,
                                         externref,
                                         builder.makeRefNull(HeapType::noext),
                                         Builder::Mutable));

    // Keep track of already wrapped functions since they can be exported
    // multiple times, but only one wrapper is needed.
    std::unordered_map<Name, Name> wrappedExports;

    // Wrap each exported function in a function that stores the suspender
    // and calls the original export.
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function &&
          canChangeState(ex->name.toString(), listedExports)) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        Name wrapperName;
        auto iter = wrappedExports.find(func->name);
        if (iter == wrappedExports.end()) {
          wrapperName = makeWrapperForExport(func, module, suspender);
          wrappedExports[func->name] = wrapperName;
        } else {
          wrapperName = iter->second;
        }
        *name = wrapperName;
      }
    }

    // Replace any references to the original exports that are in the elements.
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); i++) {
        if (auto* get = segment->data[i]->dynCast<RefFunc>()) {
          auto iter = wrappedExports.find(get->func);
          if (iter == wrappedExports.end()) {
            continue;
          }
          auto* replacementRef = builder.makeRefFunc(
            iter->second, module->getFunction(iter->second)->type);
          segment->data[i] = replacementRef;
        }
      }
    }

    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // Wrap each imported function in a function that gets the global suspender
    // and passes it on to the imported function.
    for (auto* im : originalFunctions) {
      if (im->imported() &&
          canChangeState(getFullFunctionName(im->module, im->base),
                         listedImports)) {
        makeWrapperForImport(im, module, suspender, wasmSplit);
      }
    }
  }